

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueInt8::write(PLYValueInt8 *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  double in_XMM0_Qa;
  
  this->value = (char)(int)in_XMM0_Qa;
  sVar1 = std::streambuf::sputc((char)__fd);
  return sVar1;
}

Assistant:

void write(std::streambuf *out, double v) { value=static_cast<char>(v); out->sputc(value); }